

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O1

bool __thiscall mailManager::login_smtp(mailManager *this,char *email,char *password)

{
  char *recvBuf;
  mailSocket *pmVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  string local_50;
  
  this->email = email;
  this->password = password;
  mailSocket::sendData(this->socket,"HELO ");
  mailSocket::sendData(this->socket,email);
  mailSocket::sendData(this->socket,"\r\n");
  recvBuf = this->recvData;
  mailSocket::recvData(this->socket,recvBuf,0x400);
  mailSocket::sendData(this->socket,"auth login\r\n");
  mailSocket::recvData(this->socket,recvBuf,0x400);
  pmVar1 = this->socket;
  sVar2 = strlen(email);
  base64_encode_abi_cxx11_(&local_50,email,(int)sVar2);
  mailSocket::sendData(pmVar1,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  mailSocket::sendData(this->socket,"\r\n");
  mailSocket::recvData(this->socket,recvBuf,0x400);
  pmVar1 = this->socket;
  sVar2 = strlen(password);
  base64_encode_abi_cxx11_(&local_50,password,(int)sVar2);
  mailSocket::sendData(pmVar1,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  mailSocket::sendData(this->socket,"\r\n");
  mailSocket::recvData(this->socket,recvBuf,0x400);
  lVar3 = 0;
  iVar4 = 0;
  do {
    iVar4 = (int)recvBuf[lVar3] + iVar4 * 10 + -0x30;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (iVar4 != 0xeb) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error : ",8);
    sVar2 = strlen(recvBuf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,recvBuf,sVar2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  return iVar4 == 0xeb;
}

Assistant:

bool mailManager::login_smtp(const char *email, const char *password) {
    int retCode = 0, i = 0;

    this->email = email;
    this->password = password;

    socket->sendData("HELO ");
    //HELO后面有个空格
    socket->sendData(email);
    socket->sendData("\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData("auth login\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData(base64_encode((char *) email, (int) strlen(email)).c_str());
    socket->sendData("\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData(base64_encode((char *) password, (int) strlen(password)).c_str());
    socket->sendData("\r\n");
    socket->recvData(recvData, BUF_SIZE);

    for (i = 0; i < 3; ++i) {
        retCode = retCode * 10 + (recvData[i] - '0');
    }


    if (retCode != 235) {
        std::cout << "error : " << recvData << std::endl;
        return false;
    }

    return true;
}